

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int xmlListAppend(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  xmlLinkPtr pxVar2;
  _xmlLink *p_Var3;
  int iVar4;
  
  iVar4 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar2 = xmlListHigherSearch(l,data);
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 != (_xmlLink *)0x0) {
      p_Var3->data = data;
      p_Var1 = pxVar2->next;
      p_Var3->next = p_Var1;
      p_Var1->prev = p_Var3;
      pxVar2->next = p_Var3;
      p_Var3->prev = pxVar2;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (1);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}